

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void http_wr_cb(void *arg)

{
  nni_aio *aio;
  nni_aio *aio_00;
  nng_err result;
  size_t sVar1;
  
  aio = (nni_aio *)((long)arg + 0x218);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x3e0));
  aio_00 = *(nni_aio **)((long)arg + 0x48);
  result = nni_aio_result(aio);
  if (result == NNG_OK) {
    if (aio_00 != (nni_aio *)0x0) {
      sVar1 = nni_aio_count(aio);
      nni_aio_bump_count(aio_00,sVar1);
      if (*(int *)((long)arg + 0x8dc) != 0) {
        nni_aio_iov_advance(aio,sVar1);
        sVar1 = nni_aio_iov_count(aio);
        if (sVar1 != 0) {
          nng_stream_send(*arg,aio);
          goto LAB_0013597d;
        }
      }
      *(undefined8 *)((long)arg + 0x48) = 0;
      sVar1 = nni_aio_count(aio_00);
      nni_aio_finish(aio_00,NNG_OK,sVar1);
      http_wr_start((nni_http_conn *)arg);
    }
  }
  else {
    if (aio_00 != (nni_aio *)0x0) {
      *(undefined8 *)((long)arg + 0x48) = 0;
      nni_aio_finish_error(aio_00,result);
    }
    http_close((nni_http_conn *)arg);
  }
LAB_0013597d:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x3e0));
  return;
}

Assistant:

static void
http_wr_cb(void *arg)
{
	nni_http_conn *conn = arg;
	nni_aio       *aio  = &conn->wr_aio;
	nni_aio       *uaio;
	nng_err        rv;
	size_t         n;

	nni_mtx_lock(&conn->mtx);

	uaio = conn->wr_uaio;

	if ((rv = nni_aio_result(aio)) != NNG_OK) {
		// We failed to complete the aio.
		if (uaio != NULL) {
			conn->wr_uaio = NULL;
			nni_aio_finish_error(uaio, rv);
		}
		http_close(conn);
		nni_mtx_unlock(&conn->mtx);
		return;
	}

	if (uaio == NULL) {
		// Write canceled?  This happens pretty much only during
		// shutdown/close, so we don't want to resume writing.
		// The stream is probably corrupted at this point anyway.
		nni_mtx_unlock(&conn->mtx);
		return;
	}

	n = nni_aio_count(aio);
	nni_aio_bump_count(uaio, n);

	if (conn->wr_flavor == HTTP_WR_RAW) {
		// For raw data, we just send partial completion
		// notices to the consumer.
		goto done;
	}
	nni_aio_iov_advance(aio, n);
	if (nni_aio_iov_count(aio) > 0) {
		// We have more to transmit - start another and leave
		// (we will get called again when it is done).
		nng_stream_send(conn->sock, aio);
		nni_mtx_unlock(&conn->mtx);
		return;
	}

done:
	conn->wr_uaio = NULL;
	nni_aio_finish(uaio, NNG_OK, nni_aio_count(uaio));

	// Start next write if another is ready.
	http_wr_start(conn);

	nni_mtx_unlock(&conn->mtx);
}